

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_MapEntryKeyTypeDouble_Test::
~ValidationErrorTest_MapEntryKeyTypeDouble_Test
          (ValidationErrorTest_MapEntryKeyTypeDouble_Test *this)

{
  ValidationErrorTest::~ValidationErrorTest(&this->super_ValidationErrorTest);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, MapEntryKeyTypeDouble) {
  FileDescriptorProto file_proto;
  FillValidMapEntry(&file_proto);
  FieldDescriptorProto* key =
      file_proto.mutable_message_type(0)->mutable_nested_type(0)->mutable_field(
          0);
  key->set_type(FieldDescriptorProto::TYPE_DOUBLE);
  BuildFileWithErrors(file_proto, kMapEntryKeyTypeErrorMessage);
}